

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<int>::GrowNoAnnotate
          (RepeatedField<int> *this,bool was_soo,int old_size,int new_size)

{
  uint uVar1;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 aVar2;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *paVar3;
  undefined8 *puVar4;
  int *__src;
  string *psVar5;
  undefined8 uVar6;
  undefined7 in_register_00000031;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  undefined1 auVar10 [16];
  LogMessageFatal local_40 [16];
  
  iVar9 = 2;
  if ((int)CONCAT71(in_register_00000031,was_soo) == 0) {
    iVar9 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (iVar9 < new_size) {
    if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
        (undefined1  [16])0x0) {
      aVar2.arena = internal::SooRep::soo_arena(&this->soo_rep_);
    }
    else {
      paVar3 = &heap_rep(this)->field_0;
      aVar2 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1)paVar3->arena;
    }
    uVar7 = 2;
    if (1 < new_size) {
      if (iVar9 < 0x3ffffffc) {
        if (iVar9 < 2 && iVar9 != 0) {
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
                     ,0x488,0x28,"capacity == 0 || capacity >= lower_limit");
          uVar6 = _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                            (local_40);
          absl::lts_20240722::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                    (uVar6,1," ");
          _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                    (uVar6);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
        }
        uVar1 = iVar9 * 2 + 2;
        if ((uint)new_size < uVar1) {
          new_size = uVar1;
        }
        uVar7 = (ulong)(uint)new_size;
      }
      else {
        uVar7 = 0x7fffffff;
      }
    }
    if (aVar2.arena == (Arena *)0x0) {
      uVar8 = uVar7 * 4 + 8;
      puVar4 = (undefined8 *)__tls_get_addr(&PTR_00515d90);
      if ((code *)*puVar4 == (code *)0x0) {
        paVar3 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *)operator_new(uVar8);
      }
      else {
        auVar10 = (*(code *)*puVar4)(uVar8,puVar4[1]);
        paVar3 = auVar10._0_8_;
        uVar7 = auVar10._8_8_ - 8U >> 2;
      }
      uVar8 = 0x7fffffff;
      if (uVar7 < 0x7fffffff) {
        uVar8 = uVar7;
      }
    }
    else {
      paVar3 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *)
               google::protobuf::Arena::AllocateForArray((ulong)aVar2);
      uVar8 = uVar7;
    }
    paVar3->arena = (Arena *)aVar2;
    if (0 < old_size) {
      __src = elements(this,was_soo);
      memcpy(paVar3 + 1,__src,(ulong)(uint)old_size << 2);
    }
    if (!was_soo) {
      InternalDeallocate<false>(this);
    }
    internal::SooRep::set_non_soo(&this->soo_rep_,was_soo,(int)uVar8,paVar3 + 1);
    return;
  }
  psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                     ((long)new_size,(long)iVar9,"new_size > old_capacity");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
             ,0x4a2,*(undefined8 *)(psVar5 + 8),*(undefined8 *)psVar5);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
}

Assistant:

PROTOBUF_NOINLINE void RepeatedField<Element>::GrowNoAnnotate(bool was_soo,
                                                              int old_size,
                                                              int new_size) {
  const int old_capacity = Capacity(was_soo);
  ABSL_DCHECK_GT(new_size, old_capacity);
  HeapRep* new_rep;
  Arena* arena = GetArena();

  new_size = internal::CalculateReserveSize<Element, kHeapRepHeaderSize>(
      old_capacity, new_size);

  ABSL_DCHECK_LE(static_cast<size_t>(new_size),
                 (std::numeric_limits<size_t>::max() - kHeapRepHeaderSize) /
                     sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kHeapRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == nullptr) {
    ABSL_DCHECK_LE((bytes - kHeapRepHeaderSize) / sizeof(Element),
                   static_cast<size_t>(std::numeric_limits<int>::max()))
        << "Requested size is too large to fit element count into int.";
    internal::SizedPtr res = internal::AllocateAtLeast(bytes);
    size_t num_available =
        std::min((res.n - kHeapRepHeaderSize) / sizeof(Element),
                 static_cast<size_t>(std::numeric_limits<int>::max()));
    new_size = static_cast<int>(num_available);
    new_rep = static_cast<HeapRep*>(res.p);
  } else {
    new_rep =
        reinterpret_cast<HeapRep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;

  if (old_size > 0) {
    Element* pnew = static_cast<Element*>(new_rep->elements());
    Element* pold = elements(was_soo);
    // TODO: add absl::is_trivially_relocatable<Element>
    if (std::is_trivial<Element>::value) {
      memcpy(static_cast<void*>(pnew), pold, old_size * sizeof(Element));
    } else {
      for (Element* end = pnew + old_size; pnew != end; ++pnew, ++pold) {
        ::new (static_cast<void*>(pnew)) Element(std::move(*pold));
        pold->~Element();
      }
    }
  }
  if (!was_soo) InternalDeallocate();

  soo_rep_.set_non_soo(was_soo, new_size, new_rep->elements());
}